

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<short,_signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase2
               (char lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  char cVar1;
  bool bVar2;
  short sVar3;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDX;
  undefined2 in_SI;
  char in_DIL;
  short tmp;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *unaff_retaddr;
  undefined3 in_stack_fffffffffffffff8;
  undefined4 uVar4;
  undefined1 in_stack_fffffffffffffffe;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar4 = CONCAT13(in_DIL,in_stack_fffffffffffffff8);
  cVar1 = std::numeric_limits<signed_char>::min();
  if ((in_DIL == cVar1) && (sVar3 = ::SafeInt::operator_cast_to_short(in_RDX), sVar3 == -1)) {
    bVar2 = div_negate_min<short,_signed_char,_true>::Value((short *)0x184a82);
    if (bVar2) {
      SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=
                (unaff_retaddr,
                 (short *)CONCAT17(in_stack_ffffffffffffffff,
                                   CONCAT16(in_stack_fffffffffffffffe,CONCAT24(in_SI,uVar4))));
      return true;
    }
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }